

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hash.c
# Opt level: O1

void beltHashStepG_internal(void *state)

{
  long lVar1;
  
  *(undefined8 *)((long)state + 0x20) = *(undefined8 *)((long)state + 0x10);
  *(undefined8 *)((long)state + 0x28) = *(undefined8 *)((long)state + 0x18);
  *(undefined8 *)((long)state + 0x50) = *(undefined8 *)((long)state + 0x30);
  *(undefined8 *)((long)state + 0x58) = *(undefined8 *)((long)state + 0x38);
  *(undefined8 *)((long)state + 0x60) = *(undefined8 *)((long)state + 0x40);
  *(undefined8 *)((long)state + 0x68) = *(undefined8 *)((long)state + 0x48);
  lVar1 = *(long *)((long)state + 0x90);
  if (lVar1 != 0) {
    memSet((void *)((long)state + lVar1 + 0x70),'\0',0x20 - lVar1);
    beltCompr2((u32 *)((long)state + 0x10),(u32 *)((long)state + 0x50),(u32 *)((long)state + 0x70),
               (void *)((long)state + 0x98));
  }
  beltCompr((u32 *)((long)state + 0x50),(u32 *)state,(void *)((long)state + 0x98));
  *(undefined8 *)((long)state + 0x10) = *(undefined8 *)((long)state + 0x20);
  *(undefined8 *)((long)state + 0x18) = *(undefined8 *)((long)state + 0x28);
  return;
}

Assistant:

static void beltHashStepG_internal(void* state)
{
	belt_hash_st* st = (belt_hash_st*)state;
	// pre
	ASSERT(memIsValid(state, beltHash_keep()));
	// создать копии второй части st->ls и st->h
	beltBlockCopy(st->s1, st->ls + 4);
	beltBlockCopy(st->h1, st->h);
	beltBlockCopy(st->h1 + 4, st->h + 4);
	// есть необработанные данные?
	if (st->filled)
	{
		memSetZero(st->block + st->filled, 32 - st->filled);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
		beltBlockRevU32(st->block + 16);
#endif
		beltCompr2(st->ls + 4, st->h1, (u32*)st->block, st->stack);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block + 16);
		beltBlockRevU32(st->block);
#endif
	}
	// последний блок
	beltCompr(st->h1, st->ls, st->stack);
	// восстановить сохраненную часть st->ls
	beltBlockCopy(st->ls + 4, st->s1);
}